

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined4 uVar28;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined8 uVar36;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  int iVar51;
  Mat *pMVar52;
  long lVar53;
  sbyte sVar54;
  size_t sVar55;
  int iVar56;
  Allocator *pAVar57;
  int unaff_EBP;
  uint uVar58;
  Allocator *pAVar59;
  int iVar60;
  ulong uVar61;
  long lVar62;
  bool bVar63;
  bool bVar64;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  uint local_11c;
  int _outc;
  int _outd;
  int _hoffset;
  uint local_10c;
  Mat m_1;
  int _coffset;
  Mat *local_b0;
  size_t local_a8;
  ulong local_a0;
  Mat m_2;
  int _doffset;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  undefined4 uVar30;
  undefined3 uVar32;
  undefined2 uVar34;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined3 uVar39;
  undefined1 uVar40;
  undefined2 uVar41;
  undefined1 uVar42;
  
  local_11c = bottom_blob->w;
  local_10c = bottom_blob->h;
  iVar1 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  uVar58 = bottom_blob->dims;
  local_a0 = (ulong)uVar58;
  local_a8 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  local_b0 = bottom_blob;
  if (iVar3 == 8) {
    if (uVar58 - 1 < 4) {
      lVar53 = (long)(int)local_11c;
      m.w = local_11c;
      switch(uVar58) {
      case 1:
        m.w = local_11c * 8;
        m.dims = 1;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        m.cstep = (size_t)m.w;
        goto LAB_0027d4d6;
      case 2:
        m.h = local_10c * 8;
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar53;
        goto LAB_0027d562;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar53 = (int)local_10c * lVar53;
        break;
      case 4:
        m.dims = 4;
        lVar53 = (int)local_10c * lVar53 * (long)iVar1;
        m.d = iVar1;
      }
      m.c = iVar2 * 8;
      m.cstep = lVar53 + 3U & 0x3ffffffffffffffc;
      m.h = local_10c;
LAB_0027d4d6:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_0027d562:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]),&m,
               &_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar60 = (int)local_a0;
    if (iVar60 == 1) {
      uVar58 = _outw & 7;
      bVar63 = (_outw & 3U) == 0;
      iVar60 = 8;
      if (uVar58 != 0) {
        iVar60 = (uint)bVar63 * 3 + 1;
      }
      sVar54 = 3;
      if (uVar58 != 0) {
        sVar54 = bVar63 * '\x02';
      }
      if (_outw / iVar60 == local_11c && uVar58 == 0) {
        if (top_blob != bottom_blob) {
          piVar4 = bottom_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = top_blob->data;
              pAVar59 = top_blob->allocator;
              if (pAVar59 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar59->_vptr_Allocator[3])
                          (pAVar59,pvVar5,(long)_outw % (long)iVar60 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar4 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar4;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar60 = bottom_blob->w;
          iVar56 = bottom_blob->h;
          iVar51 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar60;
          top_blob->h = iVar56;
          top_blob->d = iVar51;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_0027d752:
        bVar63 = false;
        unaff_EBP = 0;
      }
      else if (((_outw | _woffset) & 7U) == 0) {
        Mat::create(top_blob,_outw / iVar60,(local_a8 >> 3) << sVar54,8,opt->blob_allocator);
        unaff_EBP = -100;
        if (top_blob->data == (void *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar60 = _woffset + 7;
            if (-1 < _woffset) {
              iVar60 = _woffset;
            }
            crop_pack8_avx(bottom_blob,top_blob,0,iVar60 >> 3);
            goto LAB_0027d752;
          }
        }
      }
      else {
        bVar63 = true;
      }
      if (bVar63) {
        iVar60 = (int)local_a0;
        goto LAB_0027d764;
      }
LAB_0027e610:
      bVar63 = false;
    }
    else {
LAB_0027d764:
      if (iVar60 == 2) {
        sVar54 = 3;
        if ((_outh & 7U) != 0) {
          sVar54 = ((_outh & 3U) == 0) * '\x02';
        }
        if (_outw == local_11c) {
          iVar60 = 8;
          if ((_outh & 7U) != 0) {
            iVar60 = (uint)((_outh & 3U) == 0) * 3 + 1;
          }
          if (((_outh & 7U) != 0) || (_outh / iVar60 != local_10c)) goto LAB_0027d80e;
          if (top_blob != bottom_blob) {
            piVar4 = bottom_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pvVar5 = top_blob->data;
                pAVar59 = top_blob->allocator;
                if (pAVar59 == (Allocator *)0x0) {
                  if (pvVar5 != (void *)0x0) {
                    free(pvVar5);
                  }
                }
                else {
                  (*pAVar59->_vptr_Allocator[3])
                            (pAVar59,pvVar5,(long)_outh % (long)iVar60 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar4 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar4;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar60 = bottom_blob->w;
            iVar56 = bottom_blob->h;
            iVar51 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar60;
            top_blob->h = iVar56;
            top_blob->d = iVar51;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
          }
LAB_0027d8f5:
          bVar63 = false;
          unaff_EBP = 0;
        }
        else {
LAB_0027d80e:
          bVar63 = true;
          if (((_hoffset | _outh) & 7U) == 0) {
            iVar60 = _outh + 7;
            if (-1 < _outh) {
              iVar60 = _outh;
            }
            Mat::create(top_blob,_outw,iVar60 >> 3,(local_a8 >> 3) << sVar54,8,opt->blob_allocator);
            unaff_EBP = -100;
            if (top_blob->data == (void *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar60 = _hoffset + 7;
                if (-1 < _hoffset) {
                  iVar60 = _hoffset;
                }
                crop_pack8_avx(bottom_blob,top_blob,iVar60 >> 3,_woffset);
                goto LAB_0027d8f5;
              }
            }
          }
        }
        if (!bVar63) goto LAB_0027e610;
      }
      pMVar52 = local_b0;
      iVar60 = (int)local_a0;
      if (iVar60 == 3) {
        uVar61 = local_a8 >> 3;
        sVar54 = 3;
        if ((_outc & 7U) != 0) {
          sVar54 = ((_outc & 3U) == 0) * '\x02';
        }
        uVar58 = _outh ^ local_10c | _outw ^ local_11c;
        bVar63 = uVar58 == 0;
        if (bVar63) {
          iVar60 = 8;
          if ((_outc & 7U) != 0) {
            iVar60 = (uint)((_outc & 3U) == 0) * 3 + 1;
          }
          if (((_outc & 7U) != 0) || (_outc / iVar60 != iVar2)) goto LAB_0027d9cd;
          if (top_blob != local_b0) {
            piVar4 = local_b0->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pvVar5 = top_blob->data;
                pAVar59 = top_blob->allocator;
                if (pAVar59 == (Allocator *)0x0) {
                  if (pvVar5 != (void *)0x0) {
                    free(pvVar5);
                  }
                }
                else {
                  (*pAVar59->_vptr_Allocator[3])
                            (pAVar59,pvVar5,(long)_outc % (long)iVar60 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar4 = pMVar52->refcount;
            top_blob->data = pMVar52->data;
            top_blob->refcount = piVar4;
            top_blob->elemsize = pMVar52->elemsize;
            top_blob->elempack = pMVar52->elempack;
            top_blob->allocator = pMVar52->allocator;
            iVar60 = pMVar52->w;
            iVar56 = pMVar52->h;
            iVar51 = pMVar52->d;
            top_blob->dims = pMVar52->dims;
            top_blob->w = iVar60;
            top_blob->h = iVar56;
            top_blob->d = iVar51;
            top_blob->c = pMVar52->c;
            top_blob->cstep = pMVar52->cstep;
          }
          bVar64 = false;
          unaff_EBP = 0;
        }
        else {
LAB_0027d9cd:
          bVar64 = true;
          if (((_coffset | _outc) & 7U) == 0) {
            iVar60 = _coffset + 7;
            if (-1 < _coffset) {
              iVar60 = _coffset;
            }
            iVar56 = _outc + 7;
            if (-1 < _outc) {
              iVar56 = _outc;
            }
            m.c = iVar56 >> 3;
            uVar6 = local_b0->elemsize;
            m.data = (void *)((long)(iVar60 >> 3) * local_b0->cstep * uVar6 + (long)local_b0->data);
            m.elempack = local_b0->elempack;
            m.allocator = local_b0->allocator;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = (int)uVar6;
            m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            uVar8 = local_b0->dims;
            uVar9 = local_b0->w;
            uVar10 = local_b0->h;
            uVar11 = local_b0->d;
            m.cstep = ((long)local_b0->d * uVar6 * (long)local_b0->h * (long)local_b0->w + 0xf &
                      0xfffffffffffffff0) / uVar6;
            m.dims = uVar8;
            m.w = uVar9;
            m.h = uVar10;
            m.d = uVar11;
            if (bVar63) {
              Mat::clone(&m_1,(__fn *)&m,(void *)0x0,CONCAT31((int3)(uVar58 >> 8),bVar63),
                         m.allocator);
              if (&m_1 != top_blob) {
                piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = top_blob->refcount;
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    if (top_blob->allocator == (Allocator *)0x0) {
                      if (top_blob->data != (void *)0x0) {
                        free(top_blob->data);
                      }
                    }
                    else {
                      (*top_blob->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                top_blob->cstep = 0;
                top_blob->data = (void *)0x0;
                top_blob->refcount = (int *)0x0;
                *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
                *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
                top_blob->dims = 0;
                top_blob->w = 0;
                top_blob->h = 0;
                top_blob->d = 0;
                top_blob->c = 0;
                top_blob->data = m_1.data;
                top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(int)m_1.elemsize);
                top_blob->elempack = m_1.elempack;
                top_blob->allocator = m_1.allocator;
                top_blob->dims = m_1.dims;
                top_blob->w = m_1.w;
                top_blob->h = m_1.h;
                top_blob->d = m_1.d;
                top_blob->c = m_1.c;
                top_blob->cstep = m_1.cstep;
              }
              piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    if (m_1.data != (void *)0x0) {
                      free(m_1.data);
                    }
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              unaff_EBP = -100;
              if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
              goto LAB_0027dc3c;
            }
            else {
LAB_0027dc3c:
              iVar60 = _outc + 7;
              if (-1 < _outc) {
                iVar60 = _outc;
              }
              Mat::create(top_blob,_outw,_outh,iVar60 >> 3,uVar61 << sVar54,8,opt->blob_allocator);
              unaff_EBP = -100;
              if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
                if (top_blob->c < 1) {
                  unaff_EBP = 0;
                }
                else {
                  lVar53 = 0;
                  do {
                    uVar61 = CONCAT44(m.elemsize._4_4_,(int)m.elemsize);
                    m_1.data = (void *)(m.cstep * lVar53 * uVar61 + (long)m.data);
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (int)m.elemsize;
                    m_1.elemsize._4_4_ = m.elemsize._4_4_;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = m.d;
                    m_1.w = m.w;
                    m_1.dims = m.dims + -1;
                    m_1.cstep = (uVar61 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar61
                    ;
                    if (m.dims == 4) {
                      m_1.cstep = (long)m.h * (long)m.w;
                    }
                    m_2.h = top_blob->h;
                    m_2.c = top_blob->d;
                    uVar61 = top_blob->elemsize;
                    m_2.data = (void *)(top_blob->cstep * lVar53 * uVar61 + (long)top_blob->data);
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.refcount._0_4_ = 0;
                    m_2.refcount._4_4_ = 0;
                    m_2.elemsize._0_4_ = (undefined4)uVar61;
                    m_2.elemsize._4_4_ = (undefined4)(uVar61 >> 0x20);
                    m_2.d = 1;
                    sVar55 = (long)m_2.h * (long)top_blob->w;
                    m_2.w = top_blob->w;
                    m_2.dims = top_blob->dims + -1;
                    m_2.cstep = (uVar61 * sVar55 + 0xf & 0xfffffffffffffff0) / uVar61;
                    if (top_blob->dims == 4) {
                      m_2.cstep = sVar55;
                    }
                    crop_pack8_avx(&m_1,&m_2,_hoffset,_woffset);
                    m_2.cstep = 0;
                    m_2.data = (void *)0x0;
                    m_2.refcount._0_4_ = 0;
                    m_2.refcount._4_4_ = 0;
                    m_2.elemsize._0_4_ = 0;
                    m_2.elemsize._4_4_ = 0;
                    m_2.elempack = 0;
                    m_2.dims = 0;
                    m_2.w = 0;
                    m_2.h = 0;
                    m_2.d = 0;
                    m_2.c = 0;
                    piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    lVar53 = lVar53 + 1;
                  } while (lVar53 < top_blob->c);
                  unaff_EBP = 0;
                }
              }
            }
            piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  if (m.data != (void *)0x0) {
                    free(m.data);
                  }
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m.cstep = 0;
            m.data = (void *)0x0;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = 0;
            m.elemsize._4_4_ = 0;
            m.elempack = 0;
            m.dims = 0;
            m.w = 0;
            m.h = 0;
            m.d = 0;
            m.c = 0;
            bVar64 = false;
          }
        }
        if (!bVar64) goto LAB_0027e610;
        iVar60 = (int)local_a0;
      }
      pMVar52 = local_b0;
      bVar63 = true;
      if (iVar60 == 4) {
        uVar61 = local_a8 >> 3;
        sVar54 = 3;
        if ((_outc & 7U) != 0) {
          sVar54 = ((_outc & 3U) == 0) * '\x02';
        }
        uVar58 = _outh ^ local_10c | _outw ^ local_11c;
        bVar64 = _outd == iVar1;
        bVar7 = uVar58 == 0;
        if (bVar64 && bVar7) {
          iVar60 = 8;
          if ((_outc & 7U) != 0) {
            iVar60 = (uint)((_outc & 3U) == 0) * 3 + 1;
          }
          if (((_outc & 7U) == 0) && (_outc / iVar60 == iVar2)) {
            if (top_blob != local_b0) {
              piVar4 = local_b0->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  pvVar5 = top_blob->data;
                  pAVar59 = top_blob->allocator;
                  if (pAVar59 == (Allocator *)0x0) {
                    if (pvVar5 != (void *)0x0) {
                      free(pvVar5);
                    }
                  }
                  else {
                    (*pAVar59->_vptr_Allocator[3])
                              (pAVar59,pvVar5,(long)_outc % (long)iVar60 & 0xffffffff);
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              piVar4 = pMVar52->refcount;
              top_blob->data = pMVar52->data;
              top_blob->refcount = piVar4;
              top_blob->elemsize = pMVar52->elemsize;
              top_blob->elempack = pMVar52->elempack;
              top_blob->allocator = pMVar52->allocator;
              iVar60 = pMVar52->w;
              iVar56 = pMVar52->h;
              iVar51 = pMVar52->d;
              top_blob->dims = pMVar52->dims;
              top_blob->w = iVar60;
              top_blob->h = iVar56;
              top_blob->d = iVar51;
              top_blob->c = pMVar52->c;
              top_blob->cstep = pMVar52->cstep;
            }
            bVar63 = false;
            unaff_EBP = 0;
            goto LAB_0027e612;
          }
        }
        if (((_coffset | _outc) & 7U) == 0) {
          iVar60 = _coffset + 7;
          if (-1 < _coffset) {
            iVar60 = _coffset;
          }
          iVar56 = _outc + 7;
          if (-1 < _outc) {
            iVar56 = _outc;
          }
          m.c = iVar56 >> 3;
          uVar6 = local_b0->elemsize;
          m.data = (void *)((long)(iVar60 >> 3) * local_b0->cstep * uVar6 + (long)local_b0->data);
          m.elempack = local_b0->elempack;
          m.allocator = local_b0->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar6;
          m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
          uVar43 = local_b0->dims;
          uVar44 = local_b0->w;
          uVar45 = local_b0->h;
          uVar46 = local_b0->d;
          m.cstep = ((long)local_b0->d * uVar6 * (long)local_b0->h * (long)local_b0->w + 0xf &
                    0xfffffffffffffff0) / uVar6;
          m.dims = uVar43;
          m.w = uVar44;
          m.h = uVar45;
          m.d = uVar46;
          if (bVar64 && bVar7) {
            Mat::clone(&m_1,(__fn *)&m,(void *)0x0,CONCAT31((int3)(uVar58 >> 8),bVar64 && bVar7),
                       m.allocator);
            if (&m_1 != top_blob) {
              piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data = m_1.data;
              top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(int)m_1.elemsize);
              top_blob->elempack = m_1.elempack;
              top_blob->allocator = m_1.allocator;
              top_blob->dims = m_1.dims;
              top_blob->w = m_1.w;
              top_blob->h = m_1.h;
              top_blob->d = m_1.d;
              top_blob->c = m_1.c;
              top_blob->cstep = m_1.cstep;
            }
            piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0027e2d2;
          }
          else {
LAB_0027e2d2:
            iVar60 = _outc + 7;
            if (-1 < _outc) {
              iVar60 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar60 >> 3,uVar61 << sVar54,8,
                        opt->blob_allocator);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                unaff_EBP = 0;
              }
              else {
                lVar53 = 0;
                do {
                  if (0 < _outd) {
                    lVar62 = 0;
                    do {
                      m_1.cstep = (long)m.h * (long)m.w;
                      m_1.data = (void *)((long)m.data +
                                         (long)(_doffset + (int)lVar62) *
                                         CONCAT44(m.elemsize._4_4_,(int)m.elemsize) * m_1.cstep +
                                         m.cstep * lVar53 *
                                         CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (int)m.elemsize;
                      m_1.elemsize._4_4_ = m.elemsize._4_4_;
                      m_1.elempack = m.elempack;
                      m_1.allocator = m.allocator;
                      m_1.w = m.w;
                      m_1.dims = 2;
                      m_1.h = m.h;
                      m_1.d = 1;
                      m_1.c = 1;
                      m_2.h = top_blob->h;
                      sVar55 = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)top_blob->w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar62 * sVar55 * m_2.cstep +
                                         top_blob->cstep * lVar53 * sVar55);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar55;
                      m_2.elemsize._4_4_ = (undefined4)(sVar55 >> 0x20);
                      m_2.w = top_blob->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack8_avx(&m_1,&m_2,_hoffset,_woffset);
                      piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      lVar62 = lVar62 + 1;
                    } while (lVar62 < _outd);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 < top_blob->c);
                unaff_EBP = 0;
              }
            }
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          goto LAB_0027e610;
        }
      }
    }
LAB_0027e612:
    if (!bVar63) {
      return unaff_EBP;
    }
  }
  pMVar52 = local_b0;
  if (iVar3 != 4) goto LAB_0027f835;
  switch(local_b0->dims) {
  case 1:
    m.cstep = (long)local_b0->elempack * (long)local_b0->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = local_b0->w;
    lVar53 = (long)local_b0->elempack * (long)local_b0->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar53;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar53 * m.w;
    break;
  case 3:
    m.w = local_b0->w;
    m.h = local_b0->h;
    m.c = local_b0->elempack * local_b0->c;
    m.dims = 3;
    m.d = 1;
    lVar53 = (long)m.h * (long)m.w;
    goto LAB_0027e766;
  case 4:
    m.w = local_b0->w;
    m.h = local_b0->h;
    m.d = local_b0->d;
    m.c = local_b0->elempack * local_b0->c;
    m.dims = 4;
    lVar53 = (long)m.h * (long)m.w * (long)m.d;
LAB_0027e766:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar53 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  pAVar59 = (Allocator *)&_doffset;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]),&m,
             &_woffset,&_hoffset,(int *)pAVar59,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((int)local_a0 == 1) {
    uVar58 = _outw & 3;
    iVar60 = (uint)(uVar58 == 0) * 3 + 1;
    if (_outw / iVar60 == local_11c && uVar58 == 0) {
      if (top_blob != pMVar52) {
        piVar4 = pMVar52->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = top_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = top_blob->data;
            pAVar57 = top_blob->allocator;
            if (pAVar57 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar57->_vptr_Allocator[3])(pAVar57,pvVar5,(long)_outw % (long)iVar60 & 0xffffffff)
              ;
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar4 = pMVar52->refcount;
        top_blob->data = pMVar52->data;
        top_blob->refcount = piVar4;
        top_blob->elemsize = pMVar52->elemsize;
        top_blob->elempack = pMVar52->elempack;
        top_blob->allocator = pMVar52->allocator;
        iVar60 = pMVar52->w;
        iVar56 = pMVar52->h;
        iVar51 = pMVar52->d;
        top_blob->dims = pMVar52->dims;
        top_blob->w = iVar60;
        top_blob->h = iVar56;
        top_blob->d = iVar51;
        top_blob->c = pMVar52->c;
        top_blob->cstep = pMVar52->cstep;
      }
LAB_0027e9d5:
      bVar63 = false;
      unaff_EBP = 0;
    }
    else {
      bVar63 = true;
      if (((_outw | _woffset) & 3U) == 0) {
        pAVar59 = opt->blob_allocator;
        Mat::create(top_blob,_outw / iVar60,(local_a8 >> 2) << (uVar58 == 0) * '\x02',iVar60,pAVar59
                   );
        unaff_EBP = -100;
        if (top_blob->data == (void *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar60 = _woffset + 3;
            if (-1 < _woffset) {
              iVar60 = _woffset;
            }
            crop_pack4_sse(pMVar52,top_blob,0,iVar60 >> 2);
            goto LAB_0027e9d5;
          }
        }
      }
    }
    if (bVar63) goto LAB_0027e9df;
LAB_0027f81b:
    bVar63 = false;
  }
  else {
LAB_0027e9df:
    if ((int)local_a0 == 2) {
      bVar63 = (_outh & 3U) == 0;
      iVar60 = (uint)bVar63 * 3 + 1;
      pAVar59 = (Allocator *)0x0;
      if (_outw == local_11c) {
        if (((_outh & 3U) != 0) || (_outh / iVar60 != local_10c)) goto LAB_0027ea6d;
        if (top_blob != pMVar52) {
          piVar4 = pMVar52->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = top_blob->data;
              pAVar57 = top_blob->allocator;
              if (pAVar57 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar57->_vptr_Allocator[3])
                          (pAVar57,pvVar5,(long)_outh % (long)iVar60 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar4 = pMVar52->refcount;
          top_blob->data = pMVar52->data;
          top_blob->refcount = piVar4;
          top_blob->elemsize = pMVar52->elemsize;
          top_blob->elempack = pMVar52->elempack;
          top_blob->allocator = pMVar52->allocator;
          iVar60 = pMVar52->w;
          iVar56 = pMVar52->h;
          iVar51 = pMVar52->d;
          top_blob->dims = pMVar52->dims;
          top_blob->w = iVar60;
          top_blob->h = iVar56;
          top_blob->d = iVar51;
          top_blob->c = pMVar52->c;
          top_blob->cstep = pMVar52->cstep;
        }
LAB_0027eb4b:
        bVar64 = false;
        unaff_EBP = 0;
      }
      else {
LAB_0027ea6d:
        bVar64 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh / iVar60,(local_a8 >> 2) << bVar63 * '\x02',iVar60,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar60 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar60 = _hoffset;
              }
              crop_pack4_sse(pMVar52,top_blob,iVar60 >> 2,_woffset);
              goto LAB_0027eb4b;
            }
          }
        }
      }
      if (!bVar64) goto LAB_0027f81b;
    }
    pMVar52 = local_b0;
    iVar60 = (int)local_a0;
    if (iVar60 == 3) {
      bVar63 = (_outc & 3U) == 0;
      iVar60 = (uint)bVar63 * 3 + 1;
      pAVar57 = (Allocator *)((local_a8 >> 2) << bVar63 * '\x02');
      bVar63 = _outh != local_10c || _outw != local_11c;
      if (bVar63) {
LAB_0027ec06:
        bVar64 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar60;
          uVar61 = local_b0->elemsize;
          m.data = (void *)((long)(_coffset / iVar60) * local_b0->cstep * uVar61 +
                           (long)local_b0->data);
          m.elempack = local_b0->elempack;
          pAVar59 = local_b0->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar61;
          m.elemsize._4_4_ = (undefined4)(uVar61 >> 0x20);
          uVar12 = local_b0->dims;
          uVar13 = local_b0->w;
          uVar14 = local_b0->h;
          uVar15 = local_b0->d;
          m.cstep = ((long)local_b0->d * uVar61 * (long)local_b0->h * (long)local_b0->w + 0xf &
                    0xfffffffffffffff0) / uVar61;
          m.allocator = pAVar59;
          m.dims = uVar12;
          m.w = uVar13;
          m.h = uVar14;
          m.d = uVar15;
          if (bVar63) {
LAB_0027ee6c:
            Mat::create(top_blob,_outw,_outh,_outc / iVar60,(size_t)pAVar57,iVar60,
                        opt->blob_allocator);
            unaff_EBP = -100;
            pAVar59 = pAVar57;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                unaff_EBP = 0;
              }
              else {
                lVar53 = 0;
                do {
                  uVar61 = CONCAT44(m.elemsize._4_4_,(int)m.elemsize);
                  m_1.data = (void *)(m.cstep * lVar53 * uVar61 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (int)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.w = m.w;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar61 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar61;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar61 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar53 * uVar61 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  pAVar59 = (Allocator *)(ulong)(uint)m_2.elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar61;
                  m_2.elemsize._4_4_ = (undefined4)(uVar61 >> 0x20);
                  m_2.d = 1;
                  sVar55 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar61 * sVar55 + 0xf & 0xfffffffffffffff0) / uVar61;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar55;
                  }
                  crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  lVar53 = lVar53 + 1;
                } while (lVar53 < top_blob->c);
                unaff_EBP = 0;
              }
            }
          }
          else {
            Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)m.elemsize,pAVar59);
            if (&m_1 != top_blob) {
              piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data = m_1.data;
              top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(int)m_1.elemsize);
              top_blob->elempack = m_1.elempack;
              top_blob->allocator = m_1.allocator;
              top_blob->dims = m_1.dims;
              top_blob->w = m_1.w;
              top_blob->h = m_1.h;
              top_blob->d = m_1.d;
              top_blob->c = m_1.c;
              top_blob->cstep = m_1.cstep;
            }
            piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0027ee6c;
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar64 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar60 != iVar2)) goto LAB_0027ec06;
        if (top_blob != local_b0) {
          piVar4 = local_b0->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = top_blob->data;
              pAVar57 = top_blob->allocator;
              if (pAVar57 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar57->_vptr_Allocator[3])
                          (pAVar57,pvVar5,(long)_outc % (long)iVar60 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar4 = pMVar52->refcount;
          top_blob->data = pMVar52->data;
          top_blob->refcount = piVar4;
          top_blob->elemsize = pMVar52->elemsize;
          top_blob->elempack = pMVar52->elempack;
          top_blob->allocator = pMVar52->allocator;
          iVar60 = pMVar52->w;
          iVar56 = pMVar52->h;
          iVar51 = pMVar52->d;
          top_blob->dims = pMVar52->dims;
          top_blob->w = iVar60;
          top_blob->h = iVar56;
          top_blob->d = iVar51;
          top_blob->c = pMVar52->c;
          top_blob->cstep = pMVar52->cstep;
        }
        bVar64 = false;
        unaff_EBP = 0;
      }
      if (!bVar64) goto LAB_0027f81b;
      iVar60 = (int)local_a0;
    }
    pMVar52 = local_b0;
    bVar63 = true;
    if (iVar60 == 4) {
      bVar64 = (_outc & 3U) == 0;
      iVar60 = (uint)bVar64 * 3 + 1;
      local_a8 = (local_a8 >> 2) << bVar64 * '\x02';
      bVar64 = iVar1 == _outd;
      bVar7 = local_10c == _outh && local_11c == _outw;
      if (bVar64 && bVar7) {
        if (((_outc & 3U) == 0) && (_outc / iVar60 == iVar2)) {
          if (top_blob != local_b0) {
            piVar4 = local_b0->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pvVar5 = top_blob->data;
                pAVar59 = top_blob->allocator;
                if (pAVar59 == (Allocator *)0x0) {
                  if (pvVar5 != (void *)0x0) {
                    free(pvVar5);
                  }
                }
                else {
                  (*pAVar59->_vptr_Allocator[3])
                            (pAVar59,pvVar5,(long)_outc % (long)iVar60 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar4 = pMVar52->refcount;
            top_blob->data = pMVar52->data;
            top_blob->refcount = piVar4;
            top_blob->elemsize = pMVar52->elemsize;
            top_blob->elempack = pMVar52->elempack;
            top_blob->allocator = pMVar52->allocator;
            iVar1 = pMVar52->w;
            iVar2 = pMVar52->h;
            iVar60 = pMVar52->d;
            top_blob->dims = pMVar52->dims;
            top_blob->w = iVar1;
            top_blob->h = iVar2;
            top_blob->d = iVar60;
            top_blob->c = pMVar52->c;
            top_blob->cstep = pMVar52->cstep;
          }
          bVar63 = false;
          unaff_EBP = 0;
          goto LAB_0027f81d;
        }
      }
      if (((_coffset | _outc) & 3U) == 0) {
        m.c = _outc / iVar60;
        uVar61 = local_b0->elemsize;
        m.data = (void *)((long)(_coffset / iVar60) * local_b0->cstep * uVar61 +
                         (long)local_b0->data);
        m.elempack = local_b0->elempack;
        m.allocator = local_b0->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (int)uVar61;
        m.elemsize._4_4_ = (undefined4)(uVar61 >> 0x20);
        uVar47 = local_b0->dims;
        uVar48 = local_b0->w;
        uVar49 = local_b0->h;
        uVar50 = local_b0->d;
        m.cstep = ((long)local_b0->d * uVar61 * (long)local_b0->h * (long)local_b0->w + 0xf &
                  0xfffffffffffffff0) / uVar61;
        m.dims = uVar47;
        m.w = uVar48;
        m.h = uVar49;
        m.d = uVar50;
        if (bVar64 && (local_10c == _outh && local_11c == _outw)) {
          Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)m.elemsize,
                     (void *)CONCAT71((int7)((ulong)pAVar59 >> 8),bVar64 && bVar7));
          if (&m_1 != top_blob) {
            piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = m_1.data;
            top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(int)m_1.elemsize);
            top_blob->elempack = m_1.elempack;
            top_blob->allocator = m_1.allocator;
            top_blob->dims = m_1.dims;
            top_blob->w = m_1.w;
            top_blob->h = m_1.h;
            top_blob->d = m_1.d;
            top_blob->c = m_1.c;
            top_blob->cstep = m_1.cstep;
          }
          piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
          goto LAB_0027f4db;
        }
        else {
LAB_0027f4db:
          Mat::create(top_blob,_outw,_outh,_outd,_outc / iVar60,local_a8,iVar60,opt->blob_allocator)
          ;
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if (top_blob->c < 1) {
              unaff_EBP = 0;
            }
            else {
              lVar53 = 0;
              do {
                if (0 < _outd) {
                  lVar62 = 0;
                  do {
                    m_1.cstep = (long)m.h * (long)m.w;
                    m_1.data = (void *)((long)m.data +
                                       (long)(_doffset + (int)lVar62) *
                                       CONCAT44(m.elemsize._4_4_,(int)m.elemsize) * m_1.cstep +
                                       m.cstep * lVar53 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize)
                                       );
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (int)m.elemsize;
                    m_1.elemsize._4_4_ = m.elemsize._4_4_;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.w = m.w;
                    m_1.dims = 2;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    m_2.h = top_blob->h;
                    sVar55 = top_blob->elemsize;
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.cstep = (long)m_2.h * (long)top_blob->w;
                    m_2.data = (void *)((long)top_blob->data +
                                       lVar62 * sVar55 * m_2.cstep +
                                       top_blob->cstep * lVar53 * sVar55);
                    m_2.refcount._0_4_ = 0;
                    m_2.refcount._4_4_ = 0;
                    m_2.elemsize._0_4_ = (undefined4)sVar55;
                    m_2.elemsize._4_4_ = (undefined4)(sVar55 >> 0x20);
                    m_2.w = top_blob->w;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
                    piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (m_2.allocator == (Allocator *)0x0) {
                          if (m_2.data != (void *)0x0) {
                            free(m_2.data);
                          }
                        }
                        else {
                          (*(m_2.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_2.cstep = 0;
                    m_2.data = (void *)0x0;
                    m_2.refcount._0_4_ = 0;
                    m_2.refcount._4_4_ = 0;
                    m_2.elemsize._0_4_ = 0;
                    m_2.elemsize._4_4_ = 0;
                    m_2.elempack = 0;
                    m_2.dims = 0;
                    m_2.w = 0;
                    m_2.h = 0;
                    m_2.d = 0;
                    m_2.c = 0;
                    piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    lVar62 = lVar62 + 1;
                  } while (lVar62 < _outd);
                }
                lVar53 = lVar53 + 1;
              } while (lVar53 < top_blob->c);
              unaff_EBP = 0;
            }
          }
        }
        piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_0027f81b;
      }
    }
  }
LAB_0027f81d:
  if (bVar63) {
LAB_0027f835:
    piVar4 = local_b0->refcount;
    m.data = local_b0->data;
    m.refcount._0_4_ = SUB84(local_b0->refcount,0);
    m.refcount._4_4_ = (undefined4)((ulong)local_b0->refcount >> 0x20);
    m.elemsize._0_4_ = (int)local_b0->elemsize;
    m.elemsize._4_4_ = (undefined4)(local_b0->elemsize >> 0x20);
    m.elempack = local_b0->elempack;
    m.allocator = local_b0->allocator;
    uVar16 = local_b0->dims;
    uVar17 = local_b0->w;
    uVar18 = local_b0->h;
    uVar19 = local_b0->d;
    m.c = local_b0->c;
    m.cstep = local_b0->cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    m.dims = uVar16;
    m.w = uVar17;
    m.h = uVar18;
    m.d = uVar19;
    if (iVar3 != 1) {
      m_1.data = *(void **)opt;
      uVar20 = opt->openmp_blocktime;
      uVar21 = opt->use_winograd_convolution;
      uVar23 = opt->use_sgemm_convolution;
      uVar25 = opt->use_int8_inference;
      uVar27 = opt->use_vulkan_compute;
      uVar26 = CONCAT11(uVar27,uVar25);
      uVar24 = CONCAT21(uVar26,uVar23);
      uVar22 = CONCAT31(uVar24,uVar21);
      m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
      m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar28 = opt->flush_denormals;
      uVar29 = opt->use_local_pool_allocator;
      uVar31 = opt->use_shader_local_memory;
      uVar33 = opt->use_cooperative_matrix;
      uVar35 = opt->use_winograd23_convolution;
      uVar34 = CONCAT11(uVar35,uVar33);
      uVar32 = CONCAT21(uVar34,uVar31);
      uVar30 = CONCAT31(uVar32,uVar29);
      uVar36._0_1_ = opt->use_winograd43_convolution;
      uVar36._1_1_ = opt->use_winograd63_convolution;
      uVar36._2_1_ = opt->use_a53_a55_optimized_kernel;
      uVar36._3_1_ = opt->use_reserved_7;
      uVar37 = opt->use_reserved_8;
      uVar38 = opt->use_reserved_9;
      uVar40 = opt->use_reserved_10;
      uVar42 = opt->use_reserved_11;
      uVar41 = CONCAT11(uVar42,uVar40);
      uVar39 = CONCAT21(uVar41,uVar38);
      uVar36._4_4_ = CONCAT31(uVar39,uVar37);
      m_1.c = (int)uVar36;
      m_1.elemsize._0_4_ = (int)opt->workspace_allocator;
      m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.elempack = uVar20;
      m_1._28_4_ = uVar22;
      m_1.h = uVar28;
      m_1.d = uVar30;
      m_1._60_4_ = uVar36._4_4_;
      convert_packing(local_b0,&m,1,(Option *)&m_1);
    }
    unaff_EBP = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86_avx +
                                      (long)this->_vptr_Crop_x86_avx[-3]),&m,top_blob,opt);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return unaff_EBP;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}